

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O0

void pythonIgnorableWhitespace(void *user_data,xmlChar *ch,int len)

{
  int iVar1;
  int local_34;
  PyObject *pPStack_30;
  int type;
  PyObject *result;
  PyObject *handler;
  int len_local;
  xmlChar *ch_local;
  void *user_data_local;
  
  pPStack_30 = (PyObject *)0x0;
  local_34 = 0;
  iVar1 = PyObject_HasAttrString(user_data,"ignorableWhitespace");
  if (iVar1 == 0) {
    iVar1 = PyObject_HasAttrString(user_data,"data");
    if (iVar1 != 0) {
      local_34 = 2;
    }
  }
  else {
    local_34 = 1;
  }
  if (local_34 != 0) {
    if (local_34 == 1) {
      pPStack_30 = (PyObject *)
                   _PyObject_CallMethod_SizeT(user_data,"ignorableWhitespace","s#",ch,(long)len);
    }
    else if (local_34 == 2) {
      pPStack_30 = (PyObject *)_PyObject_CallMethod_SizeT(user_data,"data","s#",ch,(long)len);
    }
    _Py_XDECREF(pPStack_30);
  }
  return;
}

Assistant:

static void
pythonIgnorableWhitespace(void *user_data, const xmlChar * ch, int len)
{
    PyObject *handler;
    PyObject *result = NULL;
    int type = 0;

    handler = (PyObject *) user_data;
    if (PyObject_HasAttrString(handler, (char *) "ignorableWhitespace"))
        type = 1;
    else if (PyObject_HasAttrString(handler, (char *) "data"))
        type = 2;
    if (type != 0) {
        if (type == 1)
            result =
                PyObject_CallMethod(handler,
                                    (char *) "ignorableWhitespace",
                                    (char *) "s#", ch, (Py_ssize_t)len);
        else if (type == 2)
            result =
                PyObject_CallMethod(handler, (char *) "data",
                                    (char *) "s#", ch, (Py_ssize_t)len);
        Py_XDECREF(result);
    }
}